

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O2

HTS_Boolean HTS_pattern_match(char *string,char *pattern)

{
  HTS_Boolean HVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  char buff [1024];
  undefined8 uStack_420;
  char local_418 [1024];
  
  uStack_420 = 0x14b7c6;
  sVar2 = strlen(pattern);
  sVar4 = 0;
  lVar7 = 0;
  lVar5 = 0;
  lVar6 = 0;
  do {
    if (sVar2 == sVar4) {
      if (((lVar5 == 2 && lVar6 == 0) && (*pattern == '*')) && (pattern[sVar2 - 1] == '*')) {
        for (lVar5 = 0; sVar2 - 2 != lVar5; lVar5 = lVar5 + 1) {
          local_418[lVar5] = pattern[lVar5 + 1];
        }
        local_418[sVar2 - 2] = '\0';
        uStack_420 = 0x14b855;
        pcVar3 = strstr(string,local_418);
        return pcVar3 != (char *)0x0;
      }
      uStack_420 = 0x14b82a;
      sVar2 = strlen(string);
      HVar1 = HTS_dp_match(string,pattern,0,sVar2 - lVar7);
      return HVar1;
    }
    if (pattern[sVar4] == '?') {
      lVar6 = lVar6 + 1;
LAB_0014b7eb:
      lVar7 = lVar7 + 1;
    }
    else {
      if (pattern[sVar4] != '*') goto LAB_0014b7eb;
      lVar5 = lVar5 + 1;
    }
    sVar4 = sVar4 + 1;
  } while( true );
}

Assistant:

static HTS_Boolean HTS_pattern_match(const char *string, const char *pattern)
{
   size_t i, j;
   size_t buff_length, max = 0, nstar = 0, nquestion = 0;
   char buff[HTS_MAXBUFLEN];
   size_t pattern_length = strlen(pattern);

   for (i = 0; i < pattern_length; i++) {
      switch (pattern[i]) {
      case '*':
         nstar++;
         break;
      case '?':
         nquestion++;
         max++;
         break;
      default:
         max++;
      }
   }
   if (nstar == 2 && nquestion == 0 && pattern[0] == '*' && pattern[i - 1] == '*') {
      /* only string matching is required */
      buff_length = i - 2;
      for (i = 0, j = 1; i < buff_length; i++, j++)
         buff[i] = pattern[j];
      buff[buff_length] = '\0';
      if (strstr(string, buff) != NULL)
         return TRUE;
      else
         return FALSE;
   } else
      return HTS_dp_match(string, pattern, 0, strlen(string) - max);
}